

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZEqnArray<float>_*,_10>::~TPZManVector(TPZManVector<TPZEqnArray<float>_*,_10> *this)

{
  TPZEqnArray<float> **ppTVar1;
  
  ppTVar1 = (this->super_TPZVec<TPZEqnArray<float>_*>).fStore;
  if (ppTVar1 == this->fExtAlloc) {
    (this->super_TPZVec<TPZEqnArray<float>_*>).fStore = (TPZEqnArray<float> **)0x0;
    (this->super_TPZVec<TPZEqnArray<float>_*>).fNAlloc = 0;
    (this->super_TPZVec<TPZEqnArray<float>_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019a1ca0;
  }
  else {
    (this->super_TPZVec<TPZEqnArray<float>_*>).fNAlloc = 0;
    (this->super_TPZVec<TPZEqnArray<float>_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019a1ca0;
    if (ppTVar1 != (TPZEqnArray<float> **)0x0) {
      operator_delete__(ppTVar1);
      return;
    }
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}